

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O1

word Shr_ManComputeTruth6(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Wrd_t *vTruths)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  word wVar4;
  word *pwVar5;
  long lVar6;
  
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                  ,0x152,
                  "word Shr_ManComputeTruth6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (0 < vLeaves->nSize) {
    piVar2 = vLeaves->pArray;
    pwVar5 = Truth;
    lVar6 = 0;
    do {
      iVar1 = piVar2[lVar6];
      if (p->nTravIdsAlloc <= iVar1) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      p->pTravIds[iVar1] = p->nTravIds;
      if ((iVar1 < 0) || (vTruths->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      vTruths->pArray[iVar1] = *pwVar5;
      lVar6 = lVar6 + 1;
      pwVar5 = pwVar5 + 1;
    } while (lVar6 < vLeaves->nSize);
  }
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->nObjs)) {
    wVar4 = Shr_ManComputeTruth6_rec
                      (p,(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555,vTruths);
    return wVar4;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

word Shr_ManComputeTruth6( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Wrd_t * vTruths )
{
    int i, iLeaf;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vLeaves, iLeaf, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iLeaf );
        Vec_WrdWriteEntry( vTruths, iLeaf, Truth[i] );
    }
    return Shr_ManComputeTruth6_rec( p, Gia_ObjId(p, pObj), vTruths );
}